

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamSequence.cpp
# Opt level: O0

void __thiscall BamTools::SamSequence::SamSequence(SamSequence *this)

{
  string *in_RDI;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [20];
  allocator local_9 [9];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"",local_9);
  std::allocator<char>::~allocator((allocator<char> *)local_9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI + 0x20,"",local_1d);
  std::allocator<char>::~allocator((allocator<char> *)local_1d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI + 0x40,"",&local_1e);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI + 0x60,"",&local_1f);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI + 0x80,"",&local_20);
  std::allocator<char>::~allocator((allocator<char> *)&local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI + 0xa0,"",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  std::vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>::vector
            ((vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_> *)
             0x19e9f6);
  return;
}

Assistant:

SamSequence::SamSequence(void)
    : AssemblyID("")
    , Checksum("")
    , Length("")
    , Name("")
    , Species("")
    , URI("")
{ }